

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::timestamp_t,duckdb::date_t,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::LastDayOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  date_t dVar3;
  ValidityMask *result_mask;
  ValidityMask *result_data_00;
  idx_t iVar4;
  optional_idx *this;
  SelectionVector *pSVar5;
  ValidityMask *pVVar6;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar7;
  timestamp_t *ldata_3;
  date_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  timestamp_t *ldata_2;
  date_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  timestamp_t *ldata_1;
  date_t *result_data_1;
  timestamp_t *ldata;
  date_t *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  idx_t in_stack_fffffffffffffe68;
  ValidityMask *in_stack_fffffffffffffe70;
  timestamp_t in_stack_fffffffffffffe78;
  UnifiedVectorFormat *this_00;
  ValidityMask *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  idx_t in_stack_fffffffffffffeb0;
  date_t *in_stack_fffffffffffffeb8;
  timestamp_t *in_stack_fffffffffffffec0;
  undefined1 uVar8;
  void *in_stack_fffffffffffffec8;
  Vector *pVVar9;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  idx_t in_stack_fffffffffffffee0;
  date_t *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  UnifiedVectorFormat local_c8 [72];
  SelectionVector *local_80;
  optional_idx *local_78;
  date_t *local_70;
  Vector *local_68;
  optional_idx local_60;
  ValidityMask *local_58;
  ValidityMask *local_50;
  int64_t local_48;
  timestamp_t *local_38;
  date_t *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    local_50 = (ValidityMask *)FlatVector::GetData<duckdb::date_t>((Vector *)0xd17cbe);
    result_mask = (ValidityMask *)FlatVector::GetData<duckdb::timestamp_t>((Vector *)0xd17cd3);
    pVVar6 = local_50;
    local_58 = result_mask;
    result_data_00 = FlatVector::Validity((Vector *)0xd17d15);
    FlatVector::Validity((Vector *)0xd17d2a);
    ExecuteFlat<duckdb::timestamp_t,duckdb::date_t,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::LastDayOperator>>
              ((timestamp_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),(date_t *)result_data_00,
               (idx_t)local_18,pVVar6,result_mask,in_stack_fffffffffffffec8,(bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xd17bf6);
    local_38 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0xd17c0b);
    bVar2 = ConstantVector::IsNull((Vector *)0xd17c20);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      local_48 = local_38->value;
      ConstantVector::Validity(local_10);
      dVar3 = GenericUnaryWrapper::
              Operation<duckdb::DatePart::PartOperator<duckdb::LastDayOperator>,duckdb::timestamp_t,duckdb::date_t>
                        (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe68,
                         (void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      local_30->days = dVar3.days;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_60);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_68 = DictionaryVector::Child((Vector *)0xd17dcf);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<duckdb::date_t>((Vector *)0xd17df9);
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
          this = (optional_idx *)FlatVector::GetData<duckdb::timestamp_t>((Vector *)0xd17e0e);
          local_78 = this;
          optional_idx::GetIndex(this);
          FlatVector::Validity((Vector *)0xd17e4f);
          FlatVector::Validity((Vector *)0xd17e61);
          ExecuteFlat<duckdb::timestamp_t,duckdb::date_t,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::LastDayOperator>>
                    ((timestamp_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)uVar8);
          local_80 = DictionaryVector::SelVector((Vector *)0xd17ea1);
          pVVar9 = local_10;
          pSVar5 = (SelectionVector *)optional_idx::GetIndex(this);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar9,pSVar5,(ulong)local_80);
          return;
        }
      }
    }
    this_00 = local_c8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_00);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    FlatVector::GetData<duckdb::date_t>((Vector *)0xd17f49);
    UnifiedVectorFormat::GetData<duckdb::timestamp_t>(local_c8);
    pVVar6 = FlatVector::Validity((Vector *)0xd17fb4);
    uVar7 = local_21 & 1;
    ExecuteLoop<duckdb::timestamp_t,duckdb::date_t,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::LastDayOperator>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(ValidityMask *)this_00,
               in_stack_fffffffffffffed0,SUB81((ulong)pVVar6 >> 0x38,0));
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}